

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void __thiscall logger::OutputWorker::Start(OutputWorker *this)

{
  __shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  OutputWorker *local_28;
  OutputWorker *local_20;
  undefined8 local_18;
  
  std::mutex::lock(&this->StartStopLock);
  if ((this->Thread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::__cxx11::
    list<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
    ::clear(&this->QueuePublic);
    std::__cxx11::
    list<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
    ::clear(&this->QueuePrivate);
    LOCK();
    (this->Overrun).super___atomic_base<int>._M_i = 0;
    UNLOCK();
    LOCK();
    (this->FlushRequested)._M_base._M_i = false;
    UNLOCK();
    LOCK();
    (this->Terminated)._M_base._M_i = false;
    UNLOCK();
    local_20 = (OutputWorker *)Loop;
    local_18 = 0;
    local_28 = this;
    std::make_shared<std::thread,void(logger::OutputWorker::*)(),logger::OutputWorker*>
              ((type *)&_Stack_38,&local_20);
    std::__shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->Thread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>,
               &_Stack_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void OutputWorker::Start()
{
    std::lock_guard<std::mutex> locker(StartStopLock);

    // If thread is already spinning:
    if (Thread)
        return;

#if defined(_WIN32)
    CachedIsDebuggerPresent = (::IsDebuggerPresent() != FALSE);
#endif // _WIN32

    QueuePublic.clear();
    QueuePrivate.clear();

#if !defined(LOGGER_NEVER_DROP)
    Overrun = 0;
#endif // LOGGER_NEVER_DROP
    FlushRequested = false;
    Terminated = false;
    Thread = std::make_shared<std::thread>(&OutputWorker::Loop, this);

#if defined(_WIN32)
    ThreadNativeHandle = Thread->native_handle();
#endif // _WIN32
}